

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

void __thiscall FileTokenizer::skipWhitespace(FileTokenizer *this)

{
  ulong uVar1;
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer pcVar4;
  size_t length;
  undefined8 uVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  string local_a8;
  undefined1 local_88 [64];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  this_00 = &this->currentLine;
  paVar2 = &local_a8.field_2;
  uVar7 = (this->currentLine)._M_string_length;
  uVar8 = this->linePos;
  uVar10 = uVar7;
  do {
    pcVar4 = (this_00->_M_dataplus)._M_p;
    uVar9 = uVar8;
LAB_0014bc9a:
    uVar8 = uVar10;
    if (uVar9 < uVar10) {
      cVar3 = pcVar4[uVar9];
      if ((cVar3 != '\t') && (cVar3 != ' ')) {
        if (cVar3 == ';') goto LAB_0014bdba;
        goto LAB_0014bce3;
      }
      uVar8 = uVar9 + 1;
      this->linePos = uVar8;
      uVar9 = uVar8;
      if (uVar8 < uVar10) {
        do {
          cVar3 = pcVar4[uVar8];
          if ((cVar3 != ' ') && (uVar9 = uVar8, cVar3 != '\t')) break;
          uVar8 = uVar8 + 1;
          this->linePos = uVar8;
          uVar9 = uVar10;
        } while (uVar10 != uVar8);
      }
      goto LAB_0014bc9a;
    }
LAB_0014bce3:
    uVar1 = uVar9 + 1;
    if (uVar10 <= uVar1) {
      return;
    }
    pcVar4 = (this_00->_M_dataplus)._M_p;
    if ((pcVar4[uVar9] != '/') || (pcVar4[uVar1] != '/')) {
      pcVar4 = (this_00->_M_dataplus)._M_p;
      if ((pcVar4[uVar9] == '/') && (pcVar4[uVar1] == '*')) {
        uVar9 = uVar9 + 2;
        this->linePos = uVar9;
        while( true ) {
          pcVar4 = (this_00->_M_dataplus)._M_p;
          while (uVar8 = uVar9 + 1, uVar8 < uVar7) {
            if ((pcVar4[uVar9] == '*') && (pcVar4[uVar8] == '/')) {
              uVar8 = uVar9 + 2;
              uVar10 = uVar7;
              goto LAB_0014bdba;
            }
            this->linePos = uVar8;
            uVar9 = uVar8;
          }
          this->linePos = uVar8;
          bVar6 = TextFile::atEnd(this->input);
          if (bVar6) break;
          TextFile::readLine_abi_cxx11_(&local_a8,this->input);
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          this->linePos = 0;
          this->lineNumber = this->lineNumber + 1;
          uVar7 = (this->currentLine)._M_string_length;
          uVar9 = 0;
        }
        length = this->linePos;
        local_a8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Unexpected end of file in block comment","");
        createToken(this,Invalid,length,&local_a8,0,local_a8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        local_88._0_8_ = (this->token).line;
        local_88._8_5_ = (undefined5)(this->token).column;
        uVar5 = *(undefined8 *)((long)&(this->token).column + 5);
        local_88._13_3_ = (undefined3)uVar5;
        local_88._16_5_ = (undefined5)((ulong)uVar5 >> 0x18);
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
        _Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)(local_88 + 0x18),
                        (_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)&(this->token).value);
        pcVar4 = (this->token).originalText._M_dataplus._M_p;
        local_48._M_p = (pointer)&local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_48,pcVar4,pcVar4 + (this->token).originalText._M_string_length);
        std::__cxx11::list<Token,_std::allocator<Token>_>::_M_insert<Token>
                  ((list<Token,_std::allocator<Token>_> *)this,(iterator)this,(Token *)local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_p != &local_38) {
          operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
        ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                           *)(local_88 + 0x18));
      }
      return;
    }
LAB_0014bdba:
    this->linePos = uVar8;
  } while( true );
}

Assistant:

void FileTokenizer::skipWhitespace()
{
	while (true)
	{
		if (isWhitespace(currentLine,linePos))
		{
			do { linePos++; } while (isWhitespace(currentLine,linePos));
		} else if (isComment(currentLine,linePos))
		{
			linePos = currentLine.size();
		} else if (isBlockComment(currentLine,linePos))
		{
			linePos += 2;
			while(!isBlockCommentEnd(currentLine,linePos))
			{
				linePos++;
				if (linePos >= currentLine.size())
				{
					if (isInputAtEnd())
					{
						createToken(TokenType::Invalid,linePos, "Unexpected end of file in block comment");
						addToken(token);
						return;
					}
					currentLine = input->readLine();
					linePos = 0;
					lineNumber++;
				}
			}
			linePos += 2;
		} else
		{
			break;
		}
	}
}